

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O2

void idle_cb(uv_idle_t *handle)

{
  int iVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  uv_idle_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  if (send_req.handle == (uv_udp_t *)0x0) {
    if (handle == &idle_handle) {
      iVar1 = uv_idle_stop(&idle_handle);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        if (999 < loop_hang_called) {
          loop_hang_called = loop_hang_called + 1;
          uv_close(&client,0);
          uv_close(&idle_handle,0);
          return;
        }
        loop_hang_called = loop_hang_called + 1;
        iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          return;
        }
        pcVar2 = "r";
        uVar4 = 0x40;
      }
      else {
        pcVar2 = "uv_idle_stop(handle)";
        uVar4 = 0x31;
      }
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      puVar5 = (uv_idle_t *)0x0;
      pcVar3 = "0";
    }
    else {
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar2 = "(uv_idle_t*)(handle)";
      uVar4 = 0x30;
      puVar5 = &idle_handle;
      pcVar3 = "&(idle_handle)";
      eval_a = (int64_t)handle;
    }
  }
  else {
    puVar5 = (uv_idle_t *)0x0;
    pcVar3 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "send_req.handle";
    uVar4 = 0x2f;
    eval_a = (int64_t)send_req.handle;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-hang-loop.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",puVar5);
  abort();
}

Assistant:

static void idle_cb(uv_idle_t* idle) {
  uv_sleep(100);
  if (++ticks < kMaxTicks)
    return;

  uv_poll_stop(&poll_req[0]);
  uv_poll_stop(&poll_req[1]);
  uv_close((uv_handle_t*) &server_handle, NULL);
  uv_close((uv_handle_t*) &client_handle, NULL);
  uv_close((uv_handle_t*) &peer_handle, NULL);
  uv_close((uv_handle_t*) idle, NULL);
}